

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateBuilder
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  undefined1 local_d8 [8];
  MessageBuilderGenerator builderGenerator;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  io::Printer::Print<>
            (printer,
             "@java.lang.Override\npublic Builder newBuilderForType() { return newBuilder(); }\n");
  pPVar1 = local_18;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_38,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar1,
             "public static Builder newBuilder() {\n  return DEFAULT_INSTANCE.toBuilder();\n}\npublic static Builder newBuilder($classname$ prototype) {\n  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n}\n@java.lang.Override\npublic Builder toBuilder() {\n  return this == DEFAULT_INSTANCE\n      ? new Builder() : new Builder().mergeFrom(this);\n}\n\n"
             ,(char (*) [10])0x77c586,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pPVar1 = local_18;
  GeneratedCodeVersionSuffix_abi_cxx11_();
  io::Printer::Print<char[4],std::__cxx11::string>
            (pPVar1,
             "@java.lang.Override\nprotected Builder newBuilderForType(\n    com.google.protobuf.GeneratedMessage$ver$.BuilderParent parent) {\n  Builder builder = new Builder(parent);\n  return builder;\n}\n"
             ,(char (*) [4])0x76cf09,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &builderGenerator.oneofs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string
            ((string *)&builderGenerator.oneofs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MessageBuilderGenerator::MessageBuilderGenerator
            ((MessageBuilderGenerator *)local_d8,(this->super_MessageGenerator).descriptor_,
             this->context_);
  MessageBuilderGenerator::Generate((MessageBuilderGenerator *)local_d8,local_18);
  MessageBuilderGenerator::~MessageBuilderGenerator((MessageBuilderGenerator *)local_d8);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateBuilder(io::Printer* printer) {
  // LITE_RUNTIME implements this at the GeneratedMessageLite level.
  printer->Print(
      "@java.lang.Override\n"
      "public Builder newBuilderForType() { return newBuilder(); }\n");

  printer->Print(
      "public static Builder newBuilder() {\n"
      "  return DEFAULT_INSTANCE.toBuilder();\n"
      "}\n"
      "public static Builder newBuilder($classname$ prototype) {\n"
      "  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n"
      "}\n"
      "@java.lang.Override\n"
      "public Builder toBuilder() {\n"
      "  return this == DEFAULT_INSTANCE\n"
      "      ? new Builder() : new Builder().mergeFrom(this);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "@java.lang.Override\n"
      "protected Builder newBuilderForType(\n"
      "    com.google.protobuf.GeneratedMessage$ver$.BuilderParent parent) {\n"
      "  Builder builder = new Builder(parent);\n"
      "  return builder;\n"
      "}\n",
      "ver", GeneratedCodeVersionSuffix());

  MessageBuilderGenerator builderGenerator(descriptor_, context_);
  builderGenerator.Generate(printer);
}